

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contains.hpp
# Opt level: O1

bool linq::Contains<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>,int>
               (ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int> *source,int *item)

{
  IEnumerable<int> *pIVar1;
  int iVar2;
  char cVar3;
  
  (**((source->source1).state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
     _M_ptr)->_vptr_IState)();
  (**((source->source2).state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
     _M_ptr)->_vptr_IState)();
  iVar2 = (*((source->source1).state.
             super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_IState
            [1])();
  source->s1 = SUB41(iVar2,0);
  while( true ) {
    cVar3 = '\x01';
    if (source->s1 == false) {
      iVar2 = (*((source->source2).state.
                 super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_IState[1])();
      cVar3 = (char)iVar2;
    }
    if (cVar3 == '\0') {
      return (bool)cVar3;
    }
    pIVar1 = &source->source2;
    if (source->s1 != false) {
      pIVar1 = &source->source1;
    }
    iVar2 = (*((pIVar1->state).super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_IState[3])();
    if (iVar2 == *item) break;
    ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>::Advance(source);
  }
  return (bool)cVar3;
}

Assistant:

bool Contains(S&& source, const T& item)
	{
		for(source.Init() ; source.Valid() ; source.Advance())
			if(source.Current() == item)
				return true;

		return false;
	}